

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtariST.cpp
# Opt level: O0

void __thiscall
Atari::ST::ConcreteMachine::ConcreteMachine
          (ConcreteMachine *this,Target *target,ROMFetcher *rom_fetcher)

{
  int iVar1;
  InputDataTweaks IVar2;
  bool bVar3;
  pointer pAVar4;
  pointer pAVar5;
  pointer pVVar6;
  uint16_t *ram;
  size_type sVar7;
  undefined4 *puVar8;
  pointer ppVar9;
  pointer pMVar10;
  pointer pDVar11;
  undefined1 local_1a8 [16];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [35];
  undefined1 local_115;
  InputDataTweaks local_114;
  bool is_early_tos;
  iterator iStack_110;
  int c;
  undefined1 local_108 [8];
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  roms;
  Request request;
  undefined1 local_a8 [4];
  Name rom_name;
  undefined1 local_98 [32];
  Cycles local_78;
  Cycles local_70 [3];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  ReadDelegate *pRStack_50;
  Time local_48;
  Time TStack_40;
  Time local_38;
  Time TStack_30;
  Time local_20;
  ROMFetcher *rom_fetcher_local;
  Target *target_local;
  ConcreteMachine *this_local;
  
  local_20 = (Time)rom_fetcher;
  rom_fetcher_local = (ROMFetcher *)target;
  target_local = (Target *)this;
  ST::Machine::Machine(&this->super_Machine);
  MachineTypes::TimedMachine::TimedMachine(&this->super_TimedMachine);
  MachineTypes::ScanProducer::ScanProducer(&this->super_ScanProducer);
  MachineTypes::AudioProducer::AudioProducer(&this->super_AudioProducer);
  MachineTypes::MouseMachine::MouseMachine(&this->super_MouseMachine);
  MachineTypes::JoystickMachine::JoystickMachine(&this->super_JoystickMachine);
  local_38.length = 0;
  local_38.clock_rate = 0;
  TStack_30.length = 0;
  TStack_30.clock_rate = 0;
  local_48.length = 0;
  local_48.clock_rate = 0;
  TStack_40.length = 0;
  TStack_40.clock_rate = 0;
  local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pRStack_50 = (ReadDelegate *)0x0;
  std::
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::set((set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
         *)&local_58);
  MachineTypes::MappedKeyboardMachine::MappedKeyboardMachine
            (&this->super_MappedKeyboardMachine,
             (set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
              *)&local_58);
  std::
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~set((set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
          *)&local_58);
  MachineTypes::MediaTarget::MediaTarget(&this->super_MediaTarget);
  ClockingHint::Observer::Observer(&this->super_Observer);
  Motorola::ACIA::ACIA::InterruptDelegate::InterruptDelegate(&this->super_InterruptDelegate);
  Motorola::MFP68901::MFP68901::InterruptDelegate::InterruptDelegate(&this->super_InterruptDelegate)
  ;
  DMAController::Delegate::Delegate(&this->super_Delegate);
  Activity::Source::Source(&this->super_Source);
  GI::AY38910::PortHandler::PortHandler(&this->super_PortHandler);
  Configurable::Device::Device(&this->super_Device);
  ST::Video::RangeObserver::RangeObserver(&this->super_RangeObserver);
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_00c9d6b0;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00c9d778;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_00c9d7c0;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_00c9d7f8;
  (this->super_MouseMachine)._vptr_MouseMachine = (_func_int **)&DAT_00c9d810;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_00c9d828;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate = (_func_int **)&DAT_00c9d840;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_00c9d870;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_00c9d8b0;
  (this->super_Observer)._vptr_Observer = (_func_int **)&DAT_00c9d8c8;
  (this->super_InterruptDelegate)._vptr_InterruptDelegate = (_func_int **)&DAT_00c9d8e0;
  (this->super_InterruptDelegate)._vptr_InterruptDelegate = (_func_int **)&DAT_00c9d8f8;
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&DAT_00c9d910;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_00c9d928;
  (this->super_PortHandler)._vptr_PortHandler = (_func_int **)&PTR_get_port_input_00c9d940;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_00c9d960;
  (this->super_RangeObserver)._vptr_RangeObserver = (_func_int **)&DAT_00c9d980;
  CPU::MC68000::Processor<Atari::ST::ConcreteMachine,_true,_true,_false>::Processor
            (&this->mc68000_,this);
  HalfCycles::HalfCycles(&this->bus_phase_);
  JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::JustInTimeActor<>(&this->video_);
  JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::JustInTimeActor<>
            (&this->mfp_);
  Cycles::Cycles(local_70,500000);
  JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::JustInTimeActor<Cycles>
            (&this->keyboard_acia_,local_70);
  Cycles::Cycles(&local_78,500000);
  JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::JustInTimeActor<Cycles>
            (&this->midi_acia_,&local_78);
  Concurrency::AsyncTaskQueue<false,_true,_void>::AsyncTaskQueue<>(&this->audio_queue_);
  GI::AY38910::AY38910<false>::AY38910SampleSource(&this->ay_,YM2149F,&this->audio_queue_);
  Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>::PullLowpass
            (&this->speaker_,&this->ay_);
  HalfCycles::HalfCycles(&this->cycles_since_audio_update_);
  JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1>::JustInTimeActor<>(&this->dma_);
  HalfCycles::HalfCycles(&this->cycles_since_ikbd_update_);
  JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::operator->
            ((JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1> *)(local_98 + 0x10));
  pAVar4 = std::
           unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
           ::operator->((unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
                         *)(local_98 + 0x10));
  JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::operator->
            ((JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1> *)local_98);
  pAVar5 = std::
           unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
           ::operator->((unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
                         *)local_98);
  IntelligentKeyboard::IntelligentKeyboard(&this->ikbd_,&pAVar4->transmit,&pAVar5->receive);
  std::
  unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
  ::~unique_ptr((unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
                 *)local_98);
  std::
  unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
  ::~unique_ptr((unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
                 *)(local_98 + 0x10));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->ram_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->rom_);
  this->rom_start_ = 0;
  this->may_defer_acias_ = true;
  this->keyboard_needs_clock_ = false;
  this->mfp_is_realtime_ = false;
  this->dma_clocking_preference_ = None;
  this->video_interrupts_pending_ = 0;
  this->previous_hsync_ = false;
  this->previous_vsync_ = false;
  IntelligentKeyboard::KeyboardMapper::KeyboardMapper(&this->keyboard_mapper_);
  MachineTypes::TimedMachine::set_clock_rate(&this->super_TimedMachine,8021247.0);
  Outputs::Speaker::LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>
  ::set_input_rate(&(this->speaker_).
                    super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>
                   ,2005311.8);
  iVar1 = *(int *)((long)&rom_fetcher_local[4].super__Function_base._M_functor + 8);
  if (iVar1 != 0) {
    if (iVar1 == 1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->ram_,0x100000);
      goto LAB_0068cf18;
    }
    if (iVar1 == 2) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->ram_,0x400000);
      goto LAB_0068cf18;
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->ram_,0x80000);
LAB_0068cf18:
  Memory::Fuzz<std::vector<unsigned_char,std::allocator<unsigned_char>>>(&this->ram_);
  JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::operator->
            ((JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1> *)local_a8);
  pVVar6 = std::
           unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
           ::operator->((unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                         *)local_a8);
  ram = (uint16_t *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->ram_);
  sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->ram_);
  ST::Video::set_ram(pVVar6,ram,sVar7 >> 1);
  std::
  unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
  ::~unique_ptr((unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                 *)local_a8);
  request.node.children.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x26;
  ROM::Request::Request
            ((Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count,AtariSTTOS100,false);
  std::
  function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
  ::operator()((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)local_108,
               (function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
                *)local_20,(Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count);
  bVar3 = ROM::Request::validate
                    ((Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (Map *)local_108);
  if (bVar3) {
    iStack_110 = std::
                 map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 ::find((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         *)local_108,
                        (key_type *)
                        ((long)&request.node.children.
                                super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    ppVar9 = std::
             _Rb_tree_iterator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator->(&stack0xfffffffffffffef0);
    Memory::PackBigEndian16(&ppVar9->second,&this->rom_);
    for (local_114.phase_linked_luminance_offset = 0.0;
        IVar2.phase_linked_luminance_offset = local_114.phase_linked_luminance_offset,
        sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->ram_),
        (int)IVar2.phase_linked_luminance_offset < (int)(sVar7 >> 0x10);
        local_114.phase_linked_luminance_offset = local_114.phase_linked_luminance_offset + 1) {
      this->memory_map_[(int)local_114.phase_linked_luminance_offset] = RAM;
    }
    for (; (int)local_114.phase_linked_luminance_offset < 0x40;
        local_114.phase_linked_luminance_offset = local_114.phase_linked_luminance_offset + 1) {
      this->memory_map_[(int)local_114.phase_linked_luminance_offset] = Floating;
    }
    for (; (int)local_114.phase_linked_luminance_offset < 0xff;
        local_114.phase_linked_luminance_offset = local_114.phase_linked_luminance_offset + 1) {
      this->memory_map_[(int)local_114.phase_linked_luminance_offset] = Unassigned;
    }
    local_115 = 1;
    this->rom_start_ = 0xfc0000;
    for (local_114.phase_linked_luminance_offset = 3.53127e-43;
        (int)local_114.phase_linked_luminance_offset < 0xff;
        local_114.phase_linked_luminance_offset = local_114.phase_linked_luminance_offset + 1) {
      this->memory_map_[(int)local_114.phase_linked_luminance_offset] = ROM;
    }
    this->memory_map_[0xfb] = Cartridge;
    this->memory_map_[0xfa] = Cartridge;
    this->memory_map_[0xff] = IO;
    reinstall_rom_vector(this);
    JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::operator->
              ((JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1> *)(local_138 + 0x10));
    pAVar4 = std::
             unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
             ::operator->((unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
                           *)(local_138 + 0x10));
    Motorola::ACIA::ACIA::set_interrupt_delegate(pAVar4,&this->super_InterruptDelegate);
    std::
    unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
    ::~unique_ptr((unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
                   *)(local_138 + 0x10));
    JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::operator->
              ((JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1> *)local_138);
    pAVar4 = std::
             unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
             ::operator->((unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
                           *)local_138);
    Motorola::ACIA::ACIA::set_interrupt_delegate(pAVar4,&this->super_InterruptDelegate);
    std::
    unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
    ::~unique_ptr((unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
                   *)local_138);
    JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::operator->
              ((JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1> *)(local_158 + 0x10));
    pAVar4 = std::
             unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
             ::operator->((unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
                           *)(local_158 + 0x10));
    ClockingHint::Source::set_clocking_hint_observer(&pAVar4->super_Source,&this->super_Observer);
    std::
    unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
    ::~unique_ptr((unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
                   *)(local_158 + 0x10));
    JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::operator->
              ((JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1> *)local_158);
    pAVar4 = std::
             unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
             ::operator->((unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
                           *)local_158);
    ClockingHint::Source::set_clocking_hint_observer(&pAVar4->super_Source,&this->super_Observer);
    std::
    unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
    ::~unique_ptr((unique_ptr<Motorola::ACIA::ACIA,_JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::SequencePointAwareDeleter>
                   *)local_158);
    ClockingHint::Source::set_clocking_hint_observer
              (&(this->ikbd_).super_Source,&this->super_Observer);
    JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::operator->
              ((JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749> *)
               (local_178 + 0x10));
    pMVar10 = std::
              unique_ptr<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
              ::operator->((unique_ptr<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
                            *)(local_178 + 0x10));
    ClockingHint::Source::set_clocking_hint_observer(&pMVar10->super_Source,&this->super_Observer);
    std::
    unique_ptr<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
    ::~unique_ptr((unique_ptr<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
                   *)(local_178 + 0x10));
    JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1>::operator->
              ((JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1> *)local_178);
    pDVar11 = std::
              unique_ptr<Atari::ST::DMAController,_JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
              ::operator->((unique_ptr<Atari::ST::DMAController,_JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                            *)local_178);
    ClockingHint::Source::set_clocking_hint_observer(&pDVar11->super_Source,&this->super_Observer);
    std::
    unique_ptr<Atari::ST::DMAController,_JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ::~unique_ptr((unique_ptr<Atari::ST::DMAController,_JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                   *)local_178);
    JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::operator->
              ((JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749> *)
               (local_198 + 0x10));
    pMVar10 = std::
              unique_ptr<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
              ::operator->((unique_ptr<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
                            *)(local_198 + 0x10));
    Motorola::MFP68901::MFP68901::set_interrupt_delegate(pMVar10,&this->super_InterruptDelegate);
    std::
    unique_ptr<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
    ::~unique_ptr((unique_ptr<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
                   *)(local_198 + 0x10));
    JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1>::operator->
              ((JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1> *)local_198);
    pDVar11 = std::
              unique_ptr<Atari::ST::DMAController,_JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
              ::operator->((unique_ptr<Atari::ST::DMAController,_JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                            *)local_198);
    DMAController::set_delegate(pDVar11,&this->super_Delegate);
    std::
    unique_ptr<Atari::ST::DMAController,_JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ::~unique_ptr((unique_ptr<Atari::ST::DMAController,_JustInTimeActor<Atari::ST::DMAController,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                   *)local_198);
    GI::AY38910::AY38910SampleSource<false>::set_port_handler
              (&(this->ay_).super_AY38910SampleSource<false>,&this->super_PortHandler);
    set_gpip_input(this);
    JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::operator->
              ((JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1> *)local_1a8);
    pVVar6 = std::
             unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
             ::operator->((unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                           *)local_1a8);
    ST::Video::set_range_observer(pVVar6,&this->super_RangeObserver);
    std::
    unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ::~unique_ptr((unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                   *)local_1a8);
    insert_media(this,(Media *)&rom_fetcher_local->_M_invoker);
    std::
    map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::~map((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            *)local_108);
    ROM::Request::~Request((Request *)&roms._M_t._M_impl.super__Rb_tree_header._M_node_count);
    return;
  }
  puVar8 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar8 = 0;
  __cxa_throw(puVar8,&ROMMachine::Error::typeinfo,0);
}

Assistant:

ConcreteMachine(const Target &target, const ROMMachine::ROMFetcher &rom_fetcher) :
			mc68000_(*this),
			keyboard_acia_(Cycles(500000)),
			midi_acia_(Cycles(500000)),
			ay_(GI::AY38910::Personality::YM2149F, audio_queue_),
			speaker_(ay_),
			ikbd_(keyboard_acia_->transmit, keyboard_acia_->receive) {
			set_clock_rate(CLOCK_RATE);
			speaker_.set_input_rate(float(CLOCK_RATE) / 4.0f);

			switch(target.memory_size) {
				default:
				case Target::MemorySize::FiveHundredAndTwelveKilobytes:
					ram_.resize(512 * 1024);
				break;
				case Target::MemorySize::OneMegabyte:
					ram_.resize(1024 * 1024);
				break;
				case Target::MemorySize::FourMegabytes:
					ram_.resize(4 * 1024 * 1024);
				break;
			}
			Memory::Fuzz(ram_);

			video_->set_ram(
				reinterpret_cast<uint16_t *>(ram_.data()),
				ram_.size() >> 1
			);

			constexpr ROM::Name rom_name = ROM::Name::AtariSTTOS100;
			ROM::Request request(rom_name);
			auto roms = rom_fetcher(request);
			if(!request.validate(roms)) {
				throw ROMMachine::Error::MissingROMs;
			}
			Memory::PackBigEndian16(roms.find(rom_name)->second, rom_);

			// Set up basic memory map.
			int c = 0;
			for(; c < int(ram_.size() >> 16); ++c) memory_map_[c] = BusDevice::RAM;
			for(; c < 0x40; ++c) memory_map_[c] = BusDevice::Floating;
			for(; c < 0xff; ++c) memory_map_[c] = BusDevice::Unassigned;

			const bool is_early_tos = true;
			if(is_early_tos) {
				rom_start_ = 0xfc0000;
				for(c = 0xfc; c < 0xff; ++c) memory_map_[c] = BusDevice::ROM;
			} else {
				rom_start_ = 0xe00000;
				for(c = 0xe0; c < 0xe4; ++c) memory_map_[c] = BusDevice::ROM;
			}

			memory_map_[0xfa] = memory_map_[0xfb] = BusDevice::Cartridge;
			memory_map_[0xff] = BusDevice::IO;

			// Copy the first 8 bytes of ROM into RAM.
			reinstall_rom_vector();

			midi_acia_->set_interrupt_delegate(this);
			keyboard_acia_->set_interrupt_delegate(this);

			midi_acia_->set_clocking_hint_observer(this);
			keyboard_acia_->set_clocking_hint_observer(this);
			ikbd_.set_clocking_hint_observer(this);
			mfp_->set_clocking_hint_observer(this);
			dma_->set_clocking_hint_observer(this);

			mfp_->set_interrupt_delegate(this);
			dma_->set_delegate(this);
			ay_.set_port_handler(this);

			set_gpip_input();

			video_->set_range_observer(this);

			// Insert any supplied media.
			insert_media(target.media);
		}